

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

Vec4 __thiscall
vkt::BindingModel::anon_unknown_1::ImageSampleInstanceImages::fetchSampleValue
          (ImageSampleInstanceImages *this,int samplePosNdx)

{
  int in_EDX;
  undefined4 in_register_00000034;
  VkImageViewType *pVVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float q;
  undefined8 extraout_XMM0_Qa;
  Texture1DArrayView TVar6;
  Texture2DArrayView TVar7;
  Texture3DView TVar8;
  TextureCubeArrayView TVar9;
  Vec4 VVar10;
  VkImageViewType *local_110;
  VkImageViewType *local_108;
  TextureLevelPyramid *local_100;
  TextureLevelPyramid *local_f8;
  TextureLevelPyramid *local_f0;
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  undefined1 local_b0 [48];
  undefined1 local_80 [8];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> levelStorage;
  undefined1 local_60 [4];
  float lod;
  Vec4 samplePos;
  Sampler *sampler;
  Sampler *samplerB;
  Sampler *samplerA;
  TextureLevelPyramid *sampleSrc;
  TextureLevelPyramid *sampleSrcB;
  TextureLevelPyramid *sampleSrcA;
  bool isSamplerCase;
  int samplePosNdx_local;
  ImageSampleInstanceImages *this_local;
  undefined8 uVar5;
  
  pVVar1 = (VkImageViewType *)CONCAT44(in_register_00000034,samplePosNdx);
  local_100 = (TextureLevelPyramid *)(pVVar1 + 6);
  if (pVVar1[0x4b] == VK_IMAGE_VIEW_TYPE_1D) {
    local_f0 = (TextureLevelPyramid *)(pVVar1 + 6);
  }
  else {
    local_f0 = (TextureLevelPyramid *)(pVVar1 + 0x14);
  }
  local_f8 = local_100;
  if (pVVar1[0x4a] != VK_IMAGE_VIEW_TYPE_1D) {
    if (in_EDX % 2 != 0) {
      local_100 = local_f0;
    }
    local_f8 = local_100;
  }
  local_110 = pVVar1 + 0x4d;
  if (pVVar1[0x4b] == VK_IMAGE_VIEW_TYPE_1D) {
    local_108 = pVVar1 + 0x4d;
  }
  else {
    local_108 = pVVar1 + 0x5c;
  }
  if (in_EDX % 2 != 0) {
    local_110 = local_108;
  }
  samplePos.m_data._8_8_ = local_110;
  VVar10 = getSamplePos((ImageSampleInstanceImages *)local_60,*pVVar1,pVVar1[1],pVVar1[2],in_EDX);
  uVar5 = VVar10.m_data._8_8_;
  levelStorage.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             local_80);
  switch(*pVVar1) {
  case VK_IMAGE_VIEW_TYPE_1D:
  case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
    TVar6 = getRef1DView(local_f8,pVVar1[1],pVVar1[2],
                         (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          *)local_80);
    local_b0._40_8_ = TVar6.m_levels;
    local_b0._32_4_ = TVar6.m_numLevels;
    fVar2 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_60);
    fVar3 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_60);
    VVar10 = tcu::Texture1DArrayView::sample
                       ((Texture1DArrayView *)this,(Sampler *)(local_b0 + 0x20),fVar2,fVar3,0.0);
    uVar5 = VVar10.m_data._8_8_;
    break;
  case VK_IMAGE_VIEW_TYPE_2D:
  case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
    TVar7 = getRef2DView(local_f8,pVVar1[1],pVVar1[2],
                         (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          *)local_80);
    local_b0._8_8_ = TVar7.m_levels;
    local_b0._0_4_ = TVar7.m_numLevels;
    fVar2 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_60);
    fVar3 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_60);
    fVar4 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_60);
    VVar10 = tcu::Texture2DArrayView::sample
                       ((Texture2DArrayView *)this,(Sampler *)local_b0,fVar2,fVar3,fVar4,0.0);
    uVar5 = VVar10.m_data._8_8_;
    break;
  case VK_IMAGE_VIEW_TYPE_3D:
    TVar8 = getRef3DView(local_f8,pVVar1[1],pVVar1[2],
                         (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          *)local_80);
    local_c0._8_8_ = TVar8.m_levels;
    local_c0._0_4_ = TVar8.m_numLevels;
    fVar2 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_60);
    fVar3 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_60);
    fVar4 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_60);
    VVar10 = tcu::Texture3DView::sample
                       ((Texture3DView *)this,(Sampler *)local_c0,fVar2,fVar3,fVar4,0.0);
    uVar5 = VVar10.m_data._8_8_;
    break;
  case VK_IMAGE_VIEW_TYPE_CUBE:
  case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
    TVar9 = getRefCubeView(local_f8,pVVar1[1],pVVar1[2],
                           (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                            *)local_80);
    local_d0._8_8_ = TVar9.m_levels;
    local_d0._0_4_ = TVar9.m_numLevels;
    fVar2 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_60);
    fVar3 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_60);
    fVar4 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_60);
    q = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_60);
    VVar10 = tcu::TextureCubeArrayView::sample
                       ((TextureCubeArrayView *)this,(Sampler *)local_d0,fVar2,fVar3,fVar4,q,0.0);
    uVar5 = VVar10.m_data._8_8_;
    break;
  default:
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this);
  }
  local_b0._16_4_ = LINEAR;
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::~vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             local_80);
  VVar10.m_data[2] = (float)(int)uVar5;
  VVar10.m_data[3] = (float)(int)((ulong)uVar5 >> 0x20);
  VVar10.m_data[0] = (float)(int)extraout_XMM0_Qa;
  VVar10.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Vec4)VVar10.m_data;
}

Assistant:

tcu::Vec4 ImageSampleInstanceImages::fetchSampleValue (int samplePosNdx) const
{
	DE_ASSERT(de::inBounds(samplePosNdx, 0, 4));

	// texture order is ABAB
	const bool									isSamplerCase	= (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_SAMPLER);
	const tcu::TextureLevelPyramid&				sampleSrcA		= m_sourceImageA;
	const tcu::TextureLevelPyramid&				sampleSrcB		= (m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) ? (m_sourceImageA) : (m_sourceImageB);
	const tcu::TextureLevelPyramid&				sampleSrc		= (isSamplerCase) ? (sampleSrcA) : ((samplePosNdx % 2) == 0) ? (sampleSrcA) : (sampleSrcB);

	// sampler order is ABAB
	const tcu::Sampler&							samplerA		= m_refSamplerA;
	const tcu::Sampler&							samplerB		= (m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) ? (m_refSamplerA) : (m_refSamplerB);
	const tcu::Sampler&							sampler			= ((samplePosNdx % 2) == 0) ? (samplerA) : (samplerB);

	const tcu::Vec4								samplePos		= getSamplePos(m_viewType, m_baseMipLevel, m_baseArraySlice, samplePosNdx);
	const float									lod				= 0.0f;
	std::vector<tcu::ConstPixelBufferAccess>	levelStorage;

	switch (m_viewType)
	{
		case vk::VK_IMAGE_VIEW_TYPE_1D:
		case vk::VK_IMAGE_VIEW_TYPE_1D_ARRAY:	return getRef1DView(sampleSrc, m_baseMipLevel, m_baseArraySlice, &levelStorage).sample(sampler, samplePos.x(), samplePos.y(), lod);
		case vk::VK_IMAGE_VIEW_TYPE_2D:
		case vk::VK_IMAGE_VIEW_TYPE_2D_ARRAY:	return getRef2DView(sampleSrc, m_baseMipLevel, m_baseArraySlice, &levelStorage).sample(sampler, samplePos.x(), samplePos.y(), samplePos.z(), lod);
		case vk::VK_IMAGE_VIEW_TYPE_3D:			return getRef3DView(sampleSrc, m_baseMipLevel, m_baseArraySlice, &levelStorage).sample(sampler, samplePos.x(), samplePos.y(), samplePos.z(), lod);
		case vk::VK_IMAGE_VIEW_TYPE_CUBE:
		case vk::VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:	return getRefCubeView(sampleSrc, m_baseMipLevel, m_baseArraySlice, &levelStorage).sample(sampler, samplePos.x(), samplePos.y(), samplePos.z(), samplePos.w(), lod);

		default:
		{
			DE_FATAL("Impossible");
			return tcu::Vec4();
		}
	}
}